

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O1

void __thiscall
despot::SimpleRockSample::PrintObs
          (SimpleRockSample *this,State *state,OBS_TYPE observation,ostream *out)

{
  char *pcVar1;
  
  pcVar1 = "GOOD";
  if (observation == 0) {
    pcVar1 = "BAD";
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar1,(ulong)(observation != 0) + 3);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void SimpleRockSample::PrintObs(const State& state, OBS_TYPE observation,
	ostream& out) const {
	out << (observation ? "GOOD" : "BAD") << endl;
}